

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

_Bool mips_cpu_tlb_fill_mips
                (CPUState *cs,vaddr address,int size,MMUAccessType access_type,int mmu_idx,
                _Bool probe,uintptr_t retaddr)

{
  uint *puVar1;
  undefined4 uVar2;
  bool bVar3;
  bool bVar4;
  _Bool _Var5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  sbyte sVar10;
  sbyte sVar11;
  byte bVar12;
  target_ulong_conflict tmp_entryhi;
  uint uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  undefined7 in_register_00000089;
  uint uVar18;
  uint uVar19;
  target_ulong_conflict real_address;
  uint uVar20;
  CPUMIPSState *pCVar21;
  ulong uVar22;
  int prot;
  uint64_t vaddr;
  uint64_t dir_entry;
  uint64_t pw_entrylo1;
  uint64_t pw_entrylo0;
  hwaddr physical;
  int32_t pw_pagemask;
  uint64_t paddr;
  int in_stack_ffffffffffffff28;
  TranslationBlock **ppTVar23;
  _Bool local_d0;
  _Bool local_cf;
  _Bool local_ce;
  _Bool local_cd;
  uint local_cc;
  CPUMIPSState *local_c8;
  int local_bc;
  ulong local_b8;
  TranslationBlock *local_b0;
  TranslationBlock *local_a8;
  TranslationBlock *local_a0;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  int local_84;
  uint local_80 [2];
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  undefined4 local_68;
  MMUAccessType local_64;
  int local_60;
  uint local_5c;
  undefined8 local_58;
  TranslationBlock *pTStack_50;
  ulong local_48;
  ulong local_40;
  hwaddr local_38;
  
  pCVar21 = (CPUMIPSState *)(cs[1].tb_jmp_cache + 0x13f);
  real_address = (target_ulong_conflict)address;
  iVar6 = get_physical_address
                    (pCVar21,(hwaddr *)local_80,&local_bc,real_address,access_type,mmu_idx,
                     in_stack_ffffffffffffff28);
  if (iVar6 != -2) {
    if (iVar6 == 0) {
      tlb_set_page_mips(cs,real_address & 0xfffff000,(ulong)(local_80[0] & 0xfffff000),local_bc,
                        mmu_idx,0x1000);
      return true;
    }
    goto LAB_00755887;
  }
  iVar6 = -2;
  if ((uint)cs[1].tb_jmp_cache[0x6b8]->pc < 2) goto LAB_00755887;
  local_68 = (undefined4)CONCAT71(in_register_00000089,probe);
  uVar8 = *(uint *)((long)cs[1].tb_jmp_cache + 0x358c);
  *(uint *)((long)cs[1].tb_jmp_cache + 0x358c) = uVar8 & 0xfffffffc;
  uVar17 = *(uint *)((long)cs[1].tb_jmp_cache + 0xec4);
  uVar7 = uVar17 >> 0x18 & 0x3f;
  uVar13 = uVar17 >> 0x12 & 0x3f;
  uVar14 = uVar17 & 0x3f;
  local_d0 = false;
  local_cd = false;
  local_ce = false;
  local_cf = false;
  local_5c = 0;
  local_a0 = (TranslationBlock *)0x0;
  local_a8 = (TranslationBlock *)0x0;
  iVar15 = ((uVar17 >> 0x1e & 1) != 0) + 2;
  uVar18 = *(uint *)(cs[1].tb_jmp_cache + 0x1d8);
  local_40 = (ulong)uVar18;
  local_6c = uVar18 >> 0x18;
  local_88 = local_6c & 0x3f;
  local_70 = uVar18 >> 0x12;
  local_8c = local_70 & 0x3f;
  sVar10 = (sbyte)local_8c;
  local_74 = uVar18 >> 0xc;
  local_90 = local_74 & 0x3f;
  sVar11 = (sbyte)local_90;
  local_58 = (TranslationBlock *)(CONCAT44(local_58._4_4_,uVar17 >> 0xc) & 0xffffffff0000003f);
  uVar18 = uVar18 >> 6 & 0x3f;
  iVar6 = -1;
  if (uVar14 < 2) {
    iVar6 = (uint)(uVar14 == 1 & *(byte *)((long)cs[1].tb_jmp_cache + 0xecc) >> 6) + iVar15;
  }
  local_cc = uVar8 & 3;
  bVar12 = (byte)iVar6;
  local_48 = 0xff;
  if (uVar14 < 2) {
    local_48 = (ulong)(iVar15 + (uint)(uVar14 == 1));
  }
  uVar20 = (((uint)(address >> (sbyte)uVar18) & ~(-1 << ((byte)(uVar17 >> 6) & 0x1f))) >> 1) <<
           ((char)local_48 + 1U & 0x1f);
  uVar16 = 1 << ((char)local_48 + 3U & 0x1f);
  local_b8 = (ulong)*(uint *)((long)cs[1].tb_jmp_cache + 0xebc);
  uVar19 = local_cc;
  local_c8 = pCVar21;
  local_84 = mmu_idx;
  local_64 = access_type;
  if (((((*(byte *)((long)cs[1].tb_jmp_cache + 0xf6b) & 1) == 0) ||
       (-1 < *(int *)((long)cs[1].tb_jmp_cache + 0xecc))) ||
      ((uVar7 == 0 && uVar13 == 0) && (int)local_58 == 0)) || (1 < uVar14)) {
    bVar3 = false;
  }
  else {
    bVar3 = false;
    local_78 = uVar18;
    if (iVar6 != -1) {
      local_94 = uVar16;
      if (uVar7 == 0) {
LAB_00755929:
        if (uVar13 != 0) {
          local_b8 = local_b8 |
                     (long)(int)(((uint)(address >> sVar10) & ~(-1 << ((byte)uVar13 & 0x1f))) <<
                                (bVar12 & 0x1f));
          ppTVar23 = &local_a8;
          iVar6 = walk_directory(local_c8,&local_b8,local_8c,&local_d0,&local_ce,
                                 (uint64_t *)&local_a0,(uint64_t *)ppTVar23);
          in_stack_ffffffffffffff28 = (int)ppTVar23;
          if (iVar6 == 0) goto LAB_00755b6a;
          if (iVar6 == 1) goto LAB_007559b7;
        }
        if ((int)local_58 != 0) {
          local_b8 = local_b8 |
                     (long)(int)(((uint)(address >> sVar11) &
                                 ~(-1 << ((byte)(uVar17 >> 0xc) & 0x1f))) << (bVar12 & 0x1f));
          ppTVar23 = &local_a8;
          iVar6 = walk_directory(local_c8,&local_b8,local_90,&local_d0,&local_cf,
                                 (uint64_t *)&local_a0,(uint64_t *)ppTVar23);
          in_stack_ffffffffffffff28 = (int)ppTVar23;
          if (iVar6 == 0) goto LAB_00755b6a;
          if (iVar6 == 1) goto LAB_007559b7;
        }
        uVar22 = (long)(int)uVar20 | local_b8;
        uVar8 = *(uint *)((long)cs[1].tb_jmp_cache + 0x358c);
        uVar17 = 3;
        if ((uVar8 >> 0x1c & 1) == 0) {
          uVar17 = uVar8 & 3;
        }
        local_b8 = uVar22;
        iVar6 = get_physical_address
                          (local_c8,&local_38,&local_60,(target_ulong_conflict)uVar22,0,uVar17,
                           in_stack_ffffffffffffff28);
        uVar17 = local_94;
        pCVar21 = local_c8;
        bVar3 = false;
        uVar19 = local_cc;
        uVar8 = local_cc;
        if (iVar6 == 0) {
          _Var5 = get_pte(local_c8,uVar22,local_94,(uint64_t *)&local_b0);
          if (_Var5) {
            uVar18 = (uint)local_40 & 0x3f;
            uVar8 = uVar18 - 0x20;
            if (uVar18 <= uVar17) {
              uVar8 = uVar18;
            }
            bVar12 = (char)uVar8 - 2;
            uVar9 = (ulong)local_b0 >> (bVar12 & 0x3f);
            local_b0 = (TranslationBlock *)((ulong)(uint)((int)uVar9 << 0x1e) | uVar9 >> 2);
            uVar22 = uVar22 | (long)(int)(uVar20 | 1 << ((uint)local_48 & 0x1f));
            uVar8 = *(uint *)((long)cs[1].tb_jmp_cache + 0x358c);
            uVar17 = 3;
            if ((uVar8 >> 0x1c & 1) == 0) {
              uVar17 = uVar8 & 3;
            }
            local_b8 = uVar22;
            local_a0 = local_b0;
            iVar6 = get_physical_address
                              (pCVar21,&local_38,&local_60,(target_ulong_conflict)uVar22,0,uVar17,
                               in_stack_ffffffffffffff28);
            bVar3 = false;
            uVar19 = local_cc;
            uVar8 = local_cc;
            if (iVar6 != 0) goto LAB_0075580c;
            _Var5 = get_pte(local_c8,uVar22,local_94,(uint64_t *)&local_b0);
            if (_Var5) {
              uVar22 = (ulong)local_b0 >> (bVar12 & 0x3f);
              local_b0 = (TranslationBlock *)((ulong)(uint)((int)uVar22 << 0x1e) | uVar22 >> 2);
              local_a8 = local_b0;
              goto LAB_007559b7;
            }
          }
LAB_00755b6a:
          bVar3 = false;
          uVar19 = local_cc;
          uVar8 = local_cc;
        }
      }
      else {
        local_b8 = local_b8 |
                   (long)(int)(((uint)(address >> (sbyte)local_88) & ~(-1 << ((byte)uVar7 & 0x1f)))
                              << (bVar12 & 0x1f));
        ppTVar23 = &local_a8;
        iVar6 = walk_directory(pCVar21,&local_b8,local_88,&local_d0,&local_cd,(uint64_t *)&local_a0,
                               (uint64_t *)ppTVar23);
        in_stack_ffffffffffffff28 = (int)ppTVar23;
        if (iVar6 == 0) goto LAB_00755b6a;
        if (iVar6 != 1) goto LAB_00755929;
LAB_007559b7:
        pCVar21 = local_c8;
        local_5c = ~(-1 << ((byte)local_78 & 0x1f));
        if (local_d0 == true) {
          uVar8 = (uint)local_cf | (uint)local_cd * 4 + (uint)local_ce * 2;
          if (uVar8 == 1) {
            local_5c = ~(-1 << ((byte)local_90 & 0x1f));
            bVar12 = (byte)local_74;
          }
          else if (uVar8 == 2) {
            local_5c = ~(-1 << ((byte)local_8c & 0x1f));
            bVar12 = (byte)local_70;
          }
          else {
            if (uVar8 != 4) goto LAB_00755b9a;
            local_5c = ~(-1 << ((byte)local_88 & 0x1f));
            bVar12 = (byte)local_6c;
          }
          local_5c = local_5c >> (bVar12 & 1);
        }
LAB_00755b9a:
        local_5c = local_5c >> 0xc;
        update_pagemask_mips(local_c8,local_5c << 0xd,(int32_t *)&local_5c);
        uVar8 = *(uint *)(cs[1].tb_jmp_cache + 0x1e5);
        uVar2 = *(undefined4 *)((long)cs[1].tb_jmp_cache + 0xea4);
        local_58 = cs[1].tb_jmp_cache[0x1d1];
        pTStack_50 = cs[1].tb_jmp_cache[0x1d2];
        *(target_ulong_conflict *)(cs[1].tb_jmp_cache + 0x1e5) =
             real_address & 0xffffe000 | uVar8 & 0xff;
        *(uint *)((long)cs[1].tb_jmp_cache + 0xea4) = local_5c;
        cs[1].tb_jmp_cache[0x1d1] = local_a0;
        cs[1].tb_jmp_cache[0x1d2] = local_a8;
        r4k_helper_tlbwr_mips(pCVar21);
        *(uint *)(cs[1].tb_jmp_cache + 0x1e5) = uVar8;
        *(undefined4 *)((long)cs[1].tb_jmp_cache + 0xea4) = uVar2;
        cs[1].tb_jmp_cache[0x1d1] = local_58;
        cs[1].tb_jmp_cache[0x1d2] = pTStack_50;
        bVar3 = true;
        uVar19 = local_cc;
        uVar8 = local_cc;
      }
    }
  }
LAB_0075580c:
  local_cc = uVar8;
  access_type = local_64;
  pCVar21 = local_c8;
  puVar1 = (uint *)((long)cs[1].tb_jmp_cache + 0x358c);
  *puVar1 = *puVar1 | uVar19;
  iVar6 = -2;
  bVar4 = true;
  if (bVar3) {
    iVar6 = get_physical_address
                      (local_c8,(hwaddr *)local_80,&local_bc,real_address,local_64,local_84,
                       in_stack_ffffffffffffff28);
    bVar4 = true;
    if (iVar6 == 0) {
      tlb_set_page_mips(cs,real_address & 0xfffff000,(ulong)(local_80[0] & 0xfffff000),local_bc,
                        local_84,0x1000);
      bVar4 = false;
      iVar6 = 0;
    }
  }
  probe = SUB41(local_68,0);
  if (!bVar4) {
    return true;
  }
LAB_00755887:
  if (probe != false) {
    return false;
  }
  raise_mmu_exception(pCVar21,real_address,access_type,iVar6);
  do_raise_exception_err_mips
            (pCVar21,cs->exception_index,*(int *)(cs[1].tb_jmp_cache + 0x6b1),retaddr);
}

Assistant:

bool mips_cpu_tlb_fill(CPUState *cs, vaddr address, int size,
                       MMUAccessType access_type, int mmu_idx,
                       bool probe, uintptr_t retaddr)
{
    MIPSCPU *cpu = MIPS_CPU(cs);
    CPUMIPSState *env = &cpu->env;
    hwaddr physical;
    int prot;
    int mips_access_type;
    int ret = TLBRET_BADADDR;

    /* data access */
    /* XXX: put correct access by using cpu_restore_state() correctly */
    mips_access_type = ACCESS_INT;
    ret = get_physical_address(env, &physical, &prot, address,
                               access_type, mips_access_type, mmu_idx);
    switch (ret) {
    case TLBRET_MATCH:
        qemu_log_mask(CPU_LOG_MMU,
                      "%s address=%" VADDR_PRIx " physical " TARGET_FMT_plx
                      " prot %d\n", __func__, address, physical, prot);
        break;
    default:
        qemu_log_mask(CPU_LOG_MMU,
                      "%s address=%" VADDR_PRIx " ret %d\n", __func__, address,
                      ret);
        break;
    }
    if (ret == TLBRET_MATCH) {
        tlb_set_page(cs, address & TARGET_PAGE_MASK,
                     physical & TARGET_PAGE_MASK, prot,
                     mmu_idx, TARGET_PAGE_SIZE);
        return true;
    }
#if !defined(TARGET_MIPS64)
    if ((ret == TLBRET_NOMATCH) && (env->tlb->nb_tlb > 1)) {
        /*
         * Memory reads during hardware page table walking are performed
         * as if they were kernel-mode load instructions.
         */
        int mode = (env->hflags & MIPS_HFLAG_KSU);
        bool ret_walker;
        env->hflags &= ~MIPS_HFLAG_KSU;
        ret_walker = page_table_walk_refill(env, address, access_type, mmu_idx);
        env->hflags |= mode;
        if (ret_walker) {
            ret = get_physical_address(env, &physical, &prot, address,
                                       access_type, mips_access_type, mmu_idx);
            if (ret == TLBRET_MATCH) {
                tlb_set_page(cs, address & TARGET_PAGE_MASK,
                             physical & TARGET_PAGE_MASK, prot,
                             mmu_idx, TARGET_PAGE_SIZE);
                return true;
            }
        }
    }
#endif
    if (probe) {
        return false;
    }

    raise_mmu_exception(env, address, access_type, ret);
    do_raise_exception_err(env, cs->exception_index, env->error_code, retaddr);
}